

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool findKeyPresses<stSampleMulti<short,4>>
               (TWaveformViewT<TSampleMI16> *waveform,TKeyPressCollectionT<TSampleMI16> *res,
               TWaveformT<TSampleMI16> *waveformThreshold,TWaveformT<TSampleMI16> *waveformMax,
               double thresholdBackground,int historySize,int historySizeReset,bool removeLowPower)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  short sVar4;
  int iVar5;
  const_reference pvVar6;
  reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  size_type *psVar10;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  reference psVar14;
  reference pvVar15;
  stKeyPressCollection<stSampleMulti<short,_4>_> *in_RCX;
  vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_> *in_RDX;
  vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
  *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  byte in_stack_00000008;
  int i_2;
  TKeyPressCollectionT<TSampleMI16> res2;
  stKeyPressData<stSampleMulti<short,_4>_> *kp_1;
  iterator __end3_1;
  iterator __begin3_1;
  type *__range3_1;
  type tmp;
  stKeyPressData<stSampleMulti<short,_4>_> *kp;
  iterator __end3;
  iterator __begin3;
  TKeyPressCollectionT<TSampleMI16> *__range3;
  double avgPower;
  size_type oldn;
  double acur_1;
  int64_t itest;
  double acur;
  int64_t ii;
  int64_t i_1;
  int64_t i;
  TWaveformT<TSampleMI16> waveformAbs;
  int64_t n;
  stSampleMulti<short,_4> *samples;
  deque<long,_std::allocator<long>_> que;
  int k;
  vector<double,_std::allocator<double>_> rbSamples;
  double rbAverage;
  int rbBegin;
  stKeyPressCollection<stSampleMulti<short,_4>_> *in_stack_fffffffffffffcf8;
  stKeyPressCollection<stSampleMulti<short,_4>_> *this;
  stKeyPressCollection<stSampleMulti<short,_4>_> *in_stack_fffffffffffffd00;
  value_type *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  stKeyPressCollection<stSampleMulti<short,_4>_> *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  deque<long,_std::allocator<long>_> *in_stack_fffffffffffffd50;
  bool local_2a2;
  bool local_289;
  int local_204;
  int local_1dc;
  __normal_iterator<stKeyPressData<stSampleMulti<short,_4>_>_*,_std::vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>_>
  local_1c8;
  undefined1 *local_1c0;
  undefined1 local_1b8 [32];
  reference local_198;
  stKeyPressData<stSampleMulti<short,_4>_> *local_190;
  __normal_iterator<stKeyPressData<stSampleMulti<short,_4>_>_*,_std::vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>_>
  local_188;
  vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
  *local_180;
  double local_178;
  size_type local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  size_type local_158;
  undefined8 local_150;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_140;
  double local_130;
  size_type local_128;
  double local_120;
  long local_118;
  size_type local_110;
  size_type local_108;
  vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_> local_f8;
  long local_e0;
  undefined8 local_d8;
  int local_78;
  undefined8 local_60;
  vector<double,_std::allocator<double>_> local_58;
  double local_40;
  int local_38;
  byte local_31;
  int local_30;
  int local_2c;
  double local_28;
  stKeyPressCollection<stSampleMulti<short,_4>_> *local_20;
  vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_> *local_18;
  vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
  *local_10;
  undefined8 *local_8;
  
  local_28 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_31 = in_stack_00000008 & 1;
  local_30 = in_R9D;
  local_2c = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::
  vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
  ::clear((vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
           *)0x144edd);
  std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::resize
            ((vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_> *)
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             (size_type)in_stack_fffffffffffffd18);
  std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::resize
            ((vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_> *)
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             (size_type)in_stack_fffffffffffffd18);
  local_38 = 0;
  local_40 = 0.0;
  local_60 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x144f5b);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             (size_type)in_stack_fffffffffffffd18,
             (value_type_conflict5 *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
             (allocator_type *)in_stack_fffffffffffffd08);
  std::allocator<double>::~allocator((allocator<double> *)0x144f8f);
  local_78 = local_2c;
  std::allocator<long>::allocator((allocator<long> *)0x144fc2);
  std::deque<long,_std::allocator<long>_>::deque
            ((deque<long,_std::allocator<long>_> *)
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             (size_type)in_stack_fffffffffffffd18,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
  std::allocator<long>::~allocator((allocator<long> *)0x144fee);
  local_d8 = *local_8;
  local_e0 = local_8[1];
  std::allocator<stSampleMulti<short,_4>_>::allocator
            ((allocator<stSampleMulti<short,_4>_> *)0x14503a);
  std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::vector
            ((vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_> *)
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             (size_type)in_stack_fffffffffffffd18,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
  std::allocator<stSampleMulti<short,_4>_>::~allocator
            ((allocator<stSampleMulti<short,_4>_> *)0x145066);
  for (local_108 = 0; (long)local_108 < local_e0; local_108 = local_108 + 1) {
    pvVar6 = std::array<short,_4UL>::operator[]
                       ((array<short,_4UL> *)in_stack_fffffffffffffd00,
                        (size_type)in_stack_fffffffffffffcf8);
    sVar4 = *pvVar6;
    if (sVar4 < 1) {
      sVar4 = -sVar4;
    }
    std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::operator[]
              (&local_f8,local_108);
    pvVar7 = std::array<short,_4UL>::operator[]
                       ((array<short,_4UL> *)in_stack_fffffffffffffd00,
                        (size_type)in_stack_fffffffffffffcf8);
    *pvVar7 = sVar4;
  }
  for (local_110 = 0; (long)local_110 < local_e0; local_110 = local_110 + 1) {
    local_118 = local_110 - (long)(local_78 / 2);
    if (-1 < local_118) {
      sVar8 = std::vector<double,_std::allocator<double>_>::size(&local_58);
      auVar16._8_4_ = (int)(sVar8 >> 0x20);
      auVar16._0_8_ = sVar8;
      auVar16._12_4_ = 0x45300000;
      local_40 = local_40 *
                 ((auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0));
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,(long)local_38);
      local_40 = local_40 - *pvVar9;
      std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::operator[]
                (&local_f8,local_110);
      pvVar7 = std::array<short,_4UL>::operator[]
                         ((array<short,_4UL> *)in_stack_fffffffffffffd00,
                          (size_type)in_stack_fffffffffffffcf8);
      sVar4 = *pvVar7;
      local_120 = (double)(int)sVar4;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,(long)local_38);
      *pvVar9 = (double)(int)sVar4;
      local_40 = local_40 + local_120;
      sVar8 = std::vector<double,_std::allocator<double>_>::size(&local_58);
      auVar17._8_4_ = (int)(sVar8 >> 0x20);
      auVar17._0_8_ = sVar8;
      auVar17._12_4_ = 0x45300000;
      local_40 = local_40 /
                 ((auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0));
      iVar5 = local_38 + 1;
      local_38 = iVar5;
      sVar8 = std::vector<double,_std::allocator<double>_>::size(&local_58);
      if ((int)sVar8 <= iVar5) {
        local_38 = 0;
      }
    }
    if ((long)local_110 < (long)local_78) {
      while( true ) {
        bVar2 = std::deque<long,_std::allocator<long>_>::empty
                          ((deque<long,_std::allocator<long>_> *)0x1453a1);
        local_289 = false;
        if (!bVar2) {
          std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::
          operator[](&local_f8,local_110);
          psVar10 = (size_type *)
                    std::deque<long,_std::allocator<long>_>::back
                              ((deque<long,_std::allocator<long>_> *)
                               CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
          std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::
          operator[](&local_f8,*psVar10);
          local_289 = std::operator>=((array<short,_4UL> *)in_stack_fffffffffffffd00,
                                      (array<short,_4UL> *)in_stack_fffffffffffffcf8);
        }
        if (local_289 == false) break;
        std::deque<long,_std::allocator<long>_>::pop_back
                  ((deque<long,_std::allocator<long>_> *)in_stack_fffffffffffffd00);
      }
      std::deque<long,_std::allocator<long>_>::push_back
                ((deque<long,_std::allocator<long>_> *)in_stack_fffffffffffffd00,
                 (value_type_conflict3 *)in_stack_fffffffffffffcf8);
    }
    else {
      while( true ) {
        bVar3 = std::deque<long,_std::allocator<long>_>::empty
                          ((deque<long,_std::allocator<long>_> *)0x145464);
        bVar2 = false;
        if (!bVar3) {
          pvVar11 = std::deque<long,_std::allocator<long>_>::front
                              ((deque<long,_std::allocator<long>_> *)
                               CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
          bVar2 = *pvVar11 <= (long)(local_110 - (long)local_78);
        }
        if (!bVar2) break;
        std::deque<long,_std::allocator<long>_>::pop_front
                  ((deque<long,_std::allocator<long>_> *)in_stack_fffffffffffffd00);
      }
      while( true ) {
        bVar2 = std::deque<long,_std::allocator<long>_>::empty
                          ((deque<long,_std::allocator<long>_> *)0x1454c6);
        local_2a2 = false;
        if (!bVar2) {
          in_stack_fffffffffffffd50 =
               (deque<long,_std::allocator<long>_> *)
               std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::
               operator[](&local_f8,local_110);
          psVar10 = (size_type *)
                    std::deque<long,_std::allocator<long>_>::back
                              ((deque<long,_std::allocator<long>_> *)
                               CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
          std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::
          operator[](&local_f8,*psVar10);
          local_2a2 = std::operator>=((array<short,_4UL> *)in_stack_fffffffffffffd00,
                                      (array<short,_4UL> *)in_stack_fffffffffffffcf8);
        }
        if (local_2a2 == false) break;
        std::deque<long,_std::allocator<long>_>::pop_back
                  ((deque<long,_std::allocator<long>_> *)in_stack_fffffffffffffd00);
      }
      std::deque<long,_std::allocator<long>_>::push_back
                ((deque<long,_std::allocator<long>_> *)in_stack_fffffffffffffd00,
                 (value_type_conflict3 *)in_stack_fffffffffffffcf8);
      local_128 = local_110 - (long)(local_78 / 2);
      if ((((long)(local_78 << 1) <= (long)local_128) &&
          ((long)local_128 < local_e0 - (local_78 << 1))) &&
         (psVar10 = (size_type *)
                    std::deque<long,_std::allocator<long>_>::front
                              ((deque<long,_std::allocator<long>_> *)
                               CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10)),
         *psVar10 == local_128)) {
        std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::operator[]
                  (&local_f8,local_128);
        pvVar7 = std::array<short,_4UL>::operator[]
                           ((array<short,_4UL> *)in_stack_fffffffffffffd00,
                            (size_type)in_stack_fffffffffffffcf8);
        local_130 = (double)(int)*pvVar7;
        if (local_28 * local_40 < local_130) {
          local_168 = *local_8;
          uStack_160 = local_8[1];
          local_158 = local_128;
          local_150 = 0;
          local_148 = 0xffffffff;
          local_144 = 0xffffffff;
          local_140 = 0x3f;
          std::
          vector<stKeyPressData<stSampleMulti<short,4>>,std::allocator<stKeyPressData<stSampleMulti<short,4>>>>
          ::emplace_back<stKeyPressData<stSampleMulti<short,4>>>
                    ((vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                     in_stack_fffffffffffffd08);
        }
      }
      dVar1 = local_28 * local_40;
      std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::operator[]
                (local_18,local_128);
      pvVar7 = std::array<short,_4UL>::operator[]
                         ((array<short,_4UL> *)in_stack_fffffffffffffd00,
                          (size_type)in_stack_fffffffffffffcf8);
      *pvVar7 = (value_type_conflict4)(int)dVar1;
      psVar10 = (size_type *)
                std::deque<long,_std::allocator<long>_>::front
                          ((deque<long,_std::allocator<long>_> *)
                           CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
      pvVar12 = std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::
                operator[](&local_f8,*psVar10);
      pvVar13 = std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::
                operator[]((vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                            *)local_20,local_128);
      *(undefined8 *)(pvVar13->super_array<short,_4UL>)._M_elems =
           *(undefined8 *)(pvVar12->super_array<short,_4UL>)._M_elems;
    }
  }
  if ((local_31 & 1) != 0) {
    do {
      local_170 = std::
                  vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  ::size(local_10);
      local_178 = 0.0;
      local_180 = local_10;
      local_188._M_current =
           (stKeyPressData<stSampleMulti<short,_4>_> *)
           std::
           vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
           ::begin(&in_stack_fffffffffffffcf8->
                    super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  );
      local_190 = (stKeyPressData<stSampleMulti<short,_4>_> *)
                  std::
                  vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  ::end(&in_stack_fffffffffffffcf8->
                         super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                       );
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<stKeyPressData<stSampleMulti<short,_4>_>_*,_std::vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>_>
                                 *)in_stack_fffffffffffffd00,
                                (__normal_iterator<stKeyPressData<stSampleMulti<short,_4>_>_*,_std::vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>_>
                                 *)in_stack_fffffffffffffcf8), bVar2) {
        local_198 = __gnu_cxx::
                    __normal_iterator<stKeyPressData<stSampleMulti<short,_4>_>_*,_std::vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>_>
                    ::operator*(&local_188);
        std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::operator[]
                  (&local_f8,local_198->pos);
        pvVar7 = std::array<short,_4UL>::operator[]
                           ((array<short,_4UL> *)in_stack_fffffffffffffd00,
                            (size_type)in_stack_fffffffffffffcf8);
        local_178 = (double)(int)*pvVar7 + local_178;
        __gnu_cxx::
        __normal_iterator<stKeyPressData<stSampleMulti<short,_4>_>_*,_std::vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>_>
        ::operator++(&local_188);
      }
      sVar8 = std::
              vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
              ::size(local_10);
      auVar18._8_4_ = (int)(sVar8 >> 0x20);
      auVar18._0_8_ = sVar8;
      auVar18._12_4_ = 0x45300000;
      local_178 = local_178 /
                  ((auVar18._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0));
      stKeyPressCollection<stSampleMulti<short,_4>_>::stKeyPressCollection
                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      local_1c0 = local_1b8;
      local_1c8._M_current =
           (stKeyPressData<stSampleMulti<short,_4>_> *)
           std::
           vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
           ::begin(&in_stack_fffffffffffffcf8->
                    super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  );
      std::
      vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ::end(&in_stack_fffffffffffffcf8->
             super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
           );
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<stKeyPressData<stSampleMulti<short,_4>_>_*,_std::vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>_>
                                 *)in_stack_fffffffffffffd00,
                                (__normal_iterator<stKeyPressData<stSampleMulti<short,_4>_>_*,_std::vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>_>
                                 *)in_stack_fffffffffffffcf8), bVar2) {
        psVar14 = __gnu_cxx::
                  __normal_iterator<stKeyPressData<stSampleMulti<short,_4>_>_*,_std::vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>_>
                  ::operator*(&local_1c8);
        std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::operator[]
                  (&local_f8,psVar14->pos);
        pvVar7 = std::array<short,_4UL>::operator[]
                           ((array<short,_4UL> *)in_stack_fffffffffffffd00,
                            (size_type)in_stack_fffffffffffffcf8);
        if (local_178 * 0.3 < (double)(int)*pvVar7) {
          std::
          vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
          ::push_back((vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                      in_stack_fffffffffffffd08);
        }
        __gnu_cxx::
        __normal_iterator<stKeyPressData<stSampleMulti<short,_4>_>_*,_std::vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>_>
        ::operator++(&local_1c8);
      }
      sVar8 = std::
              vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
              ::size(local_10);
      if (sVar8 == local_170) {
        local_1dc = 0xf;
      }
      else {
        local_1dc = 0;
      }
      stKeyPressCollection<stSampleMulti<short,_4>_>::~stKeyPressCollection
                ((stKeyPressCollection<stSampleMulti<short,_4>_> *)0x1459da);
    } while (local_1dc == 0);
  }
  sVar8 = std::
          vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
          ::size(local_10);
  if (1 < sVar8) {
    stKeyPressCollection<stSampleMulti<short,_4>_>::stKeyPressCollection(in_stack_fffffffffffffd00);
    std::
    vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ::front(&in_stack_fffffffffffffd00->
             super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
           );
    std::
    vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ::push_back((vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                in_stack_fffffffffffffd08);
    local_204 = 1;
    while (iVar5 = local_204,
          sVar8 = std::
                  vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  ::size(local_10), iVar5 < (int)sVar8) {
      pvVar15 = std::
                vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ::operator[](local_10,(long)local_204);
      in_stack_fffffffffffffd18 = (stKeyPressCollection<stSampleMulti<short,_4>_> *)pvVar15->pos;
      pvVar15 = std::
                vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ::back(&in_stack_fffffffffffffd00->
                        super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                      );
      if ((long)local_30 < (long)in_stack_fffffffffffffd18 - pvVar15->pos) {
LAB_00145b23:
        std::
        vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ::operator[](local_10,(long)local_204);
        std::
        vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ::push_back((vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                    in_stack_fffffffffffffd08);
      }
      else {
        this = local_20;
        pvVar15 = std::
                  vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  ::operator[](local_10,(long)local_204);
        in_stack_fffffffffffffd08 =
             (value_type *)
             std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::
             operator[]((vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                         *)this,pvVar15->pos);
        in_stack_fffffffffffffd00 = local_20;
        pvVar15 = std::
                  vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  ::back(&local_20->
                          super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                        );
        std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::operator[]
                  ((vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_> *)
                   in_stack_fffffffffffffd00,pvVar15->pos);
        in_stack_fffffffffffffd17 =
             std::operator>((array<short,_4UL> *)in_stack_fffffffffffffd00,(array<short,_4UL> *)this
                           );
        if ((bool)in_stack_fffffffffffffd17) goto LAB_00145b23;
      }
      local_204 = local_204 + 1;
    }
    std::swap<stKeyPressCollection<stSampleMulti<short,4>>>
              ((stKeyPressCollection<stSampleMulti<short,_4>_> *)
               CONCAT44(iVar5,in_stack_fffffffffffffd20),in_stack_fffffffffffffd18);
    stKeyPressCollection<stSampleMulti<short,_4>_>::~stKeyPressCollection
              ((stKeyPressCollection<stSampleMulti<short,_4>_> *)0x145ba9);
  }
  std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::~vector
            ((vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_> *)
             CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
  std::deque<long,_std::allocator<long>_>::~deque(in_stack_fffffffffffffd50);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
  return true;
}

Assistant:

bool findKeyPresses(
        const TWaveformViewT<TSampleMI16> & waveform,
        TKeyPressCollectionT<TSampleMI16> & res,
        TWaveformT<TSampleMI16> & waveformThreshold,
        TWaveformT<TSampleMI16> & waveformMax,
        double thresholdBackground,
        int historySize,
        int historySizeReset,
        bool removeLowPower) {
    res.clear();
    waveformThreshold.resize(waveform.n);
    waveformMax.resize(waveform.n);

    int rbBegin = 0;
    double rbAverage = 0.0;
    std::vector<double> rbSamples(8*historySize, 0.0);

    int k = historySize;
    std::deque<int64_t> que(k);

    auto samples = waveform.samples;
    auto n       = waveform.n;

    TWaveformT<TSampleMI16> waveformAbs(n);
    for (int64_t i = 0; i < n; ++i) {
        waveformAbs[i][0] = std::abs(samples[i][0]);
    }

    for (int64_t i = 0; i < n; ++i) {
        {
            int64_t ii = i - k/2;
            if (ii >= 0) {
                rbAverage *= rbSamples.size();
                rbAverage -= rbSamples[rbBegin];
                double acur = waveformAbs[i][0];
                rbSamples[rbBegin] = acur;
                rbAverage += acur;
                rbAverage /= rbSamples.size();
                if (++rbBegin >= (int) rbSamples.size()) {
                    rbBegin = 0;
                }
            }
        }

        if (i < k) {
            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }
            que.push_back(i);
        } else {
            while((!que.empty()) && que.front() <= i - k) {
                que.pop_front();
            }

            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }

            que.push_back(i);

            int64_t itest = i - k/2;
            if (itest >= 2*k && itest < n - 2*k && que.front() == itest) {
                double acur = waveformAbs[itest][0];
                if (acur > thresholdBackground*rbAverage) {
                    res.emplace_back(TKeyPressDataT<TSampleMI16> { std::move(waveform), itest, 0.0, -1, -1, '?' });
                }
            }
            waveformThreshold[itest][0] = thresholdBackground*rbAverage;
            waveformMax[itest] = waveformAbs[que.front()];
        }
    }

    if (removeLowPower) {
        while (true) {
            auto oldn = res.size();

            double avgPower = 0.0;
            for (const auto & kp : res) {
                avgPower += waveformAbs[kp.pos][0];
            }
            avgPower /= res.size();

            auto tmp = std::move(res);
            for (const auto & kp : tmp) {
                if (waveformAbs[kp.pos][0] > 0.3*avgPower) {
                    res.push_back(kp);
                }
            }

            if (res.size() == oldn) break;
        }
    }

    if (res.size() > 1) {
        TKeyPressCollectionT<TSampleMI16> res2;
        res2.push_back(res.front());

        for (int i = 1; i < (int) res.size(); ++i) {
            if (res[i].pos - res2.back().pos > historySizeReset || waveformMax[res[i].pos] > waveformMax[res2.back().pos]) {
                res2.push_back(res[i]);
            }
        }

        std::swap(res, res2);
    }

    return true;
}